

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O0

void bool_clause(vec<BoolView> *x,vec<BoolView> *y)

{
  uint uVar1;
  uint uVar2;
  BoolView *o;
  vec<BoolView> *in_RSI;
  vec<BoolView> *in_RDI;
  uint i_1;
  uint i;
  vec<Lit> ps;
  BoolView *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  Lit in_stack_ffffffffffffff84;
  Lit *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar3;
  BoolView *in_stack_ffffffffffffffa0;
  uint uVar4;
  SAT *in_stack_ffffffffffffffb0;
  uint local_3c;
  uint local_24;
  vec<Lit> local_20;
  vec<BoolView> *local_10;
  vec<BoolView> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  vec<Lit>::vec(&local_20);
  local_24 = 0;
  while( true ) {
    uVar4 = local_24;
    uVar1 = vec<BoolView>::size(local_8);
    if (uVar1 <= uVar4) break;
    in_stack_ffffffffffffffa0 = vec<BoolView>::operator[](local_8,local_24);
    BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff78);
    vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
    local_24 = local_24 + 1;
  }
  local_3c = 0;
  while( true ) {
    uVar3 = local_3c;
    uVar2 = vec<BoolView>::size(local_10);
    if (uVar2 <= uVar3) break;
    o = vec<BoolView>::operator[](local_10,local_3c);
    operator~(o);
    in_stack_ffffffffffffff84 = BoolView::operator_cast_to_Lit(in_stack_ffffffffffffff78);
    vec<Lit>::push((vec<Lit> *)CONCAT44(uVar3,in_stack_ffffffffffffff90),(Lit *)o);
    BoolView::~BoolView((BoolView *)0x25fc99);
    local_3c = local_3c + 1;
  }
  SAT::addClause(in_stack_ffffffffffffffb0,(vec<Lit> *)CONCAT44(uVar1,uVar4),
                 SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff84.x,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void bool_clause(vec<BoolView>& x, vec<BoolView>& y) {
	vec<Lit> ps;
	for (unsigned int i = 0; i < x.size(); i++) {
		ps.push(x[i]);
	}
	for (unsigned int i = 0; i < y.size(); i++) {
		ps.push(~y[i]);
	}
	sat.addClause(ps);
}